

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slots.cpp
# Opt level: O2

void __thiscall MainWindow::onFileOpen(MainWindow *this)

{
  bool bVar1;
  QString path;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  QArrayDataPointer<char16_t> local_20;
  
  bVar1 = maybeSave(this);
  if (bVar1) {
    tr((QString *)&local_20,"Open module",(char *)0x0,-1);
    QString::QString((QString *)&local_38,"");
    tr((QString *)&local_50,"Trackerboy module (*.tbm)",(char *)0x0,-1);
    QFileDialog::getOpenFileName(&path,this,&local_20,&local_38,&local_50,0,0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_20);
    if (path.d.size != 0) {
      openFile(this,&path);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&path.d);
  }
  return;
}

Assistant:

void MainWindow::onFileOpen() {
    if (!maybeSave()) {
        return;
    }
    
    auto path = QFileDialog::getOpenFileName(
        this,
        tr("Open module"),
        "",
        tr(TU::MODULE_FILE_FILTER)
    );

    if (path.isEmpty()) {
        return;
    }

    openFile(path);

}